

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::D3D6::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,D3D6 *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  MthdD3D6CombineControl *pMVar2;
  MthdD3D56TexFilter *pMVar3;
  MthdD3D56TexFormat *pMVar4;
  MthdD3D56TexOffset *pMVar5;
  MthdCtxSurf3D *pMVar6;
  SingleMthdTest *pSVar7;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar8;
  result_type rVar9;
  MthdDmaGrobj *pMVar10;
  Test *pTVar11;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_649;
  Test *local_648;
  Test *local_640;
  Test *local_638;
  Test *local_630;
  Test *local_628;
  Test *local_620;
  Test *local_618;
  Test *local_610;
  Test *local_608;
  Test *local_600;
  Test *local_5f8;
  Test *local_5f0;
  MthdD3D6CombineControl *local_5e8;
  MthdD3D6CombineControl *local_5e0;
  MthdD3D6CombineControl *local_5d8;
  MthdD3D6CombineControl *local_5d0;
  MthdD3D56TexFilter *local_5c8;
  MthdD3D56TexFilter *local_5c0;
  MthdD3D56TexFormat *local_5b8;
  MthdD3D56TexFormat *local_5b0;
  MthdD3D56TexOffset *local_5a8;
  MthdD3D56TexOffset *local_5a0;
  MthdCtxSurf3D *local_598;
  MthdDmaGrobj *local_590;
  Test *local_588;
  Test *local_580;
  SingleMthdTest *local_578;
  Test *local_570;
  MthdDmaGrobj *local_568;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_560;
  undefined1 *local_558;
  long local_550;
  undefined1 local_548 [16];
  undefined1 *local_538;
  long local_530;
  undefined1 local_528 [16];
  undefined1 *local_518;
  long local_510;
  undefined1 local_508 [16];
  undefined1 *local_4f8;
  long local_4f0;
  undefined1 local_4e8 [16];
  undefined1 *local_4d8;
  long local_4d0;
  undefined1 local_4c8 [16];
  undefined1 *local_4b8;
  long local_4b0;
  undefined1 local_4a8 [16];
  undefined1 *local_498;
  long local_490;
  undefined1 local_488 [16];
  undefined1 *local_478;
  long local_470;
  undefined1 local_468 [16];
  undefined1 *local_458;
  long local_450;
  undefined1 local_448 [16];
  undefined1 *local_438;
  long local_430;
  undefined1 local_428 [16];
  undefined1 *local_418;
  long local_410;
  undefined1 local_408 [16];
  undefined1 *local_3f8;
  long local_3f0;
  undefined1 local_3e8 [16];
  undefined1 *local_3d8;
  long local_3d0;
  undefined1 local_3c8 [16];
  undefined1 *local_3b8;
  long local_3b0;
  undefined1 local_3a8 [16];
  undefined1 *local_398;
  long local_390;
  undefined1 local_388 [16];
  undefined1 *local_378;
  long local_370;
  undefined1 local_368 [16];
  undefined1 *local_358;
  long local_350;
  undefined1 local_348 [16];
  undefined1 *local_338;
  long local_330;
  undefined1 local_328 [16];
  undefined1 *local_318;
  long local_310;
  undefined1 local_308 [16];
  undefined1 *local_2f8;
  long local_2f0;
  undefined1 local_2e8 [16];
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  SingleMthdTest *local_138;
  Test *local_130;
  Test *local_128;
  MthdDmaGrobj *local_120;
  MthdDmaGrobj *local_118;
  MthdCtxSurf3D *local_110;
  MthdD3D56TexOffset *local_108;
  MthdD3D56TexOffset *local_100;
  MthdD3D56TexFormat *local_f8;
  MthdD3D56TexFormat *local_f0;
  MthdD3D56TexFilter *local_e8;
  MthdD3D56TexFilter *local_e0;
  MthdD3D6CombineControl *local_d8;
  MthdD3D6CombineControl *local_d0;
  MthdD3D6CombineControl *local_c8;
  MthdD3D6CombineControl *local_c0;
  Test *local_b8;
  Test *local_b0;
  Test *local_a8;
  Test *local_a0;
  Test *local_98;
  Test *local_90;
  Test *local_88;
  Test *local_80;
  Test *local_78;
  Test *local_70;
  Test *local_68;
  Test *local_60;
  Test *local_58;
  Test *local_50;
  Test *local_48;
  Test *local_40;
  Test *local_38;
  
  local_578 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"nop","");
  pSVar7 = local_578;
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_578,opt,(uint32_t)rVar9);
  (pSVar7->super_MthdTest).trapbit = -1;
  (pSVar7->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  pSVar7->s_cls = uVar1;
  pSVar7->s_mthd = 0x100;
  pSVar7->s_stride = 4;
  pSVar7->s_num = 1;
  pSVar7->s_trapbit = -1;
  (pSVar7->name)._M_dataplus._M_p = (pointer)&(pSVar7->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&pSVar7->name,local_2f8,local_2f8 + local_2f0)
  ;
  (pSVar7->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_003489c8;
  local_138 = pSVar7;
  local_580 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_318 = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"notify","");
  pTVar11 = local_580;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_580,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_318,local_318 + local_310);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_130 = pTVar11;
  local_588 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_338 = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"dma_notify","");
  pTVar11 = local_588;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_588,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_338,local_338 + local_330);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349850;
  local_128 = pTVar11;
  pMVar10 = (MthdDmaGrobj *)operator_new(0x25960);
  local_568 = pMVar10;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"dma_tex_a","");
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar10,opt,(uint32_t)rVar9,&local_158,-1,(this->super_Class).cls,0x184,0,4);
  local_120 = pMVar10;
  local_590 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"dma_tex_b","");
  pMVar10 = local_590;
  MthdDmaGrobj::MthdDmaGrobj
            (local_590,opt,(uint32_t)rVar9,&local_178,-1,(this->super_Class).cls,0x188,1,4);
  local_118 = pMVar10;
  local_598 = (MthdCtxSurf3D *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"ctx_surf3d","");
  pMVar6 = local_598;
  MthdCtxSurf3D::MthdCtxSurf3D
            (local_598,opt,(uint32_t)rVar9,&local_198,-1,(this->super_Class).cls,0x18c,0);
  local_110 = pMVar6;
  local_5a0 = (MthdD3D56TexOffset *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"tex_0_offset","");
  pMVar5 = local_5a0;
  MthdD3D56TexOffset::MthdD3D56TexOffset
            (local_5a0,opt,(uint32_t)rVar9,&local_1b8,-1,(this->super_Class).cls,0x308,1);
  local_108 = pMVar5;
  local_5a8 = (MthdD3D56TexOffset *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"tex_1_offset","");
  pMVar5 = local_5a8;
  MthdD3D56TexOffset::MthdD3D56TexOffset
            (local_5a8,opt,(uint32_t)rVar9,&local_1d8,-1,(this->super_Class).cls,0x30c,2);
  local_100 = pMVar5;
  local_5b0 = (MthdD3D56TexFormat *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"tex_0_format","");
  pMVar4 = local_5b0;
  MthdD3D56TexFormat::MthdD3D56TexFormat
            (local_5b0,opt,(uint32_t)rVar9,&local_1f8,-1,(this->super_Class).cls,0x310,1);
  local_f8 = pMVar4;
  local_5b8 = (MthdD3D56TexFormat *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"tex_1_format","");
  pMVar4 = local_5b8;
  MthdD3D56TexFormat::MthdD3D56TexFormat
            (local_5b8,opt,(uint32_t)rVar9,&local_218,-1,(this->super_Class).cls,0x314,2);
  local_f0 = pMVar4;
  local_5c0 = (MthdD3D56TexFilter *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"tex_0_filter","");
  pMVar3 = local_5c0;
  MthdD3D56TexFilter::MthdD3D56TexFilter
            (local_5c0,opt,(uint32_t)rVar9,&local_238,-1,(this->super_Class).cls,0x318,1);
  local_e8 = pMVar3;
  local_5c8 = (MthdD3D56TexFilter *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"tex_1_filter","");
  pMVar3 = local_5c8;
  MthdD3D56TexFilter::MthdD3D56TexFilter
            (local_5c8,opt,(uint32_t)rVar9,&local_258,-1,(this->super_Class).cls,0x31c,2);
  local_e0 = pMVar3;
  local_5d0 = (MthdD3D6CombineControl *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"combine_0_control_alpha","")
  ;
  pMVar2 = local_5d0;
  MthdD3D6CombineControl::MthdD3D6CombineControl
            (local_5d0,opt,(uint32_t)rVar9,&local_278,-1,(this->super_Class).cls,800,0,0);
  local_d8 = pMVar2;
  local_5d8 = (MthdD3D6CombineControl *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"combine_0_control_color","")
  ;
  pMVar2 = local_5d8;
  MthdD3D6CombineControl::MthdD3D6CombineControl
            (local_5d8,opt,(uint32_t)rVar9,&local_298,-1,(this->super_Class).cls,0x324,0,1);
  local_d0 = pMVar2;
  local_5e0 = (MthdD3D6CombineControl *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"combine_1_control_alpha","")
  ;
  pMVar2 = local_5e0;
  MthdD3D6CombineControl::MthdD3D6CombineControl
            (local_5e0,opt,(uint32_t)rVar9,&local_2b8,-1,(this->super_Class).cls,0x32c,1,0);
  local_c8 = pMVar2;
  local_5e8 = (MthdD3D6CombineControl *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"combine_1_control_color","")
  ;
  pMVar2 = local_5e8;
  MthdD3D6CombineControl::MthdD3D6CombineControl
            (local_5e8,opt,(uint32_t)rVar9,&local_2d8,-1,(this->super_Class).cls,0x330,1,1);
  local_c0 = pMVar2;
  local_5f0 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"combine_factor","");
  pTVar11 = local_5f0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_5f0,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x334;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_358,local_358 + local_350);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00351770;
  local_b8 = pTVar11;
  local_5f8 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"blend","");
  pTVar11 = local_5f8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_5f8,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x338;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_378,local_378 + local_370);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00351390;
  local_b0 = pTVar11;
  local_600 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_398 = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"config","");
  pTVar11 = local_600;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_600,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x33c;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_398,local_398 + local_390);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00351488;
  local_a8 = pTVar11;
  local_608 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3b8 = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"stencil_func","");
  pTVar11 = local_608;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_608,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x340;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_3b8,local_3b8 + local_3b0);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00351868;
  local_a0 = pTVar11;
  local_610 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"stencil_op","");
  pTVar11 = local_610;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_610,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x344;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_3d8,local_3d8 + local_3d0);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00351960;
  local_98 = pTVar11;
  local_618 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3f8 = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"fog_color","");
  pTVar11 = local_618;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_618,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x348;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_3f8,local_3f8 + local_3f0);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_003506f8;
  local_90 = pTVar11;
  local_620 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_418 = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"tlv_x","");
  pTVar11 = local_620;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_620,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x400;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_418,local_418 + local_410);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350bd0;
  local_88 = pTVar11;
  local_628 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_438 = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"tlv_y","");
  pTVar11 = local_628;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_628,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x404;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_438,local_438 + local_430);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350cc8;
  local_80 = pTVar11;
  local_630 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_458 = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"tlv_z","");
  pTVar11 = local_630;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_630,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x408;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_458,local_458 + local_450);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350dc0;
  local_78 = pTVar11;
  local_638 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"tlv_rhw","");
  pTVar11 = local_638;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_638,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x40c;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_478,local_478 + local_470);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350eb8;
  local_70 = pTVar11;
  local_640 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_498 = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"tlv_color","");
  pTVar11 = local_640;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_640,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x410;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_498,local_498 + local_490);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350ad8;
  local_68 = pTVar11;
  local_648 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_4b8 = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"tlv_fog_col1","");
  pTVar11 = local_648;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_648,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x414;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_4b8,local_4b8 + local_4b0);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00351580;
  local_60 = pTVar11;
  pTVar11 = (Test *)operator_new(0x25960);
  local_570 = pTVar11;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_4d8 = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"tlv_u_0","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar11,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x418;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_4d8,local_4d8 + local_4d0);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350fb0;
  pTVar11[0x1e].rnd._M_x[0x119] = 0;
  *(undefined1 *)(pTVar11[0x1e].rnd._M_x + 0x11a) = 0;
  local_58 = pTVar11;
  pTVar11 = (Test *)operator_new(0x25960);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_4f8 = local_4e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"tlv_v_0","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar11,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x41c;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_4f8,local_4f8 + local_4f0);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350fb0;
  pTVar11[0x1e].rnd._M_x[0x119] = 1;
  *(undefined1 *)(pTVar11[0x1e].rnd._M_x + 0x11a) = 0;
  local_50 = pTVar11;
  pTVar11 = (Test *)operator_new(0x25960);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_518 = local_508;
  local_560 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"tlv_u_1","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar11,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x420;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_518,local_518 + local_510);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350fb0;
  pTVar11[0x1e].rnd._M_x[0x119] = 0x100000000;
  *(undefined1 *)(pTVar11[0x1e].rnd._M_x + 0x11a) = 0;
  local_48 = pTVar11;
  pTVar11 = (Test *)operator_new(0x25960);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_538 = local_528;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"tlv_v_1","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar11,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x424;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_538,local_538 + local_530);
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350fb0;
  pTVar11[0x1e].rnd._M_x[0x119] = 0x100000001;
  *(undefined1 *)(pTVar11[0x1e].rnd._M_x + 0x11a) = 1;
  local_40 = pTVar11;
  pTVar11 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_558 = local_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"draw","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar11,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar11[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x894) = 0x540;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar11[0x1e].rnd._M_x + 0x89c) = 0x30;
  *(undefined4 *)(pTVar11[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar11[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar11[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar11[0x1e].rnd._M_x + 0x115),local_558,local_558 + local_550);
  pvVar8 = local_560;
  pTVar11->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034d010;
  __l._M_len = 0x21;
  __l._M_array = &local_138;
  local_38 = pTVar11;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_560,__l,&local_649);
  if (local_558 != local_548) {
    operator_delete(local_558);
  }
  if (local_538 != local_528) {
    operator_delete(local_538);
  }
  if (local_518 != local_508) {
    operator_delete(local_518);
  }
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8);
  }
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8);
  }
  if (local_4b8 != local_4a8) {
    operator_delete(local_4b8);
  }
  if (local_498 != local_488) {
    operator_delete(local_498);
  }
  if (local_478 != local_468) {
    operator_delete(local_478);
  }
  if (local_458 != local_448) {
    operator_delete(local_458);
  }
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8);
  }
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8);
  }
  if (local_398 != local_388) {
    operator_delete(local_398);
  }
  if (local_378 != local_368) {
    operator_delete(local_378);
  }
  if (local_358 != local_348) {
    operator_delete(local_358);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (local_338 != local_328) {
    operator_delete(local_338);
  }
  if (local_318 != local_308) {
    operator_delete(local_318);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  return pvVar8;
}

Assistant:

std::vector<SingleMthdTest *> D3D6::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", -1, cls, 0x104),
		new MthdDmaNotify(opt, rnd(), "dma_notify", -1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_a", -1, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_b", -1, cls, 0x188, 1, DMA_R | DMA_ALIGN),
		new MthdCtxSurf3D(opt, rnd(), "ctx_surf3d", -1, cls, 0x18c, SURF2D_NV4),
		new MthdD3D56TexOffset(opt, rnd(), "tex_0_offset", -1, cls, 0x308, 1),
		new MthdD3D56TexOffset(opt, rnd(), "tex_1_offset", -1, cls, 0x30c, 2),
		new MthdD3D56TexFormat(opt, rnd(), "tex_0_format", -1, cls, 0x310, 1),
		new MthdD3D56TexFormat(opt, rnd(), "tex_1_format", -1, cls, 0x314, 2),
		new MthdD3D56TexFilter(opt, rnd(), "tex_0_filter", -1, cls, 0x318, 1),
		new MthdD3D56TexFilter(opt, rnd(), "tex_1_filter", -1, cls, 0x31c, 2),
		new MthdD3D6CombineControl(opt, rnd(), "combine_0_control_alpha", -1, cls, 0x320, 0, 0),
		new MthdD3D6CombineControl(opt, rnd(), "combine_0_control_color", -1, cls, 0x324, 0, 1),
		new MthdD3D6CombineControl(opt, rnd(), "combine_1_control_alpha", -1, cls, 0x32c, 1, 0),
		new MthdD3D6CombineControl(opt, rnd(), "combine_1_control_color", -1, cls, 0x330, 1, 1),
		new MthdD3D6CombineFactor(opt, rnd(), "combine_factor", -1, cls, 0x334),
		new MthdD3D56Blend(opt, rnd(), "blend", -1, cls, 0x338),
		new MthdD3D56Config(opt, rnd(), "config", -1, cls, 0x33c),
		new MthdD3D6StencilFunc(opt, rnd(), "stencil_func", -1, cls, 0x340),
		new MthdD3D6StencilOp(opt, rnd(), "stencil_op", -1, cls, 0x344),
		new MthdD3D56FogColor(opt, rnd(), "fog_color", -1, cls, 0x348),
		new MthdD3D56TlvX(opt, rnd(), "tlv_x", -1, cls, 0x400, 8, 0x28),
		new MthdD3D56TlvY(opt, rnd(), "tlv_y", -1, cls, 0x404, 8, 0x28),
		new MthdD3D56TlvZ(opt, rnd(), "tlv_z", -1, cls, 0x408, 8, 0x28),
		new MthdD3D56TlvRhw(opt, rnd(), "tlv_rhw", -1, cls, 0x40c, 8, 0x28),
		new MthdD3D56TlvColor(opt, rnd(), "tlv_color", -1, cls, 0x410, 8, 0x28),
		new MthdD3D56TlvFogCol1(opt, rnd(), "tlv_fog_col1", -1, cls, 0x414, 8, 0x28),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_u_0", -1, cls, 0x418, 8, 0x28, 0, 0, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_v_0", -1, cls, 0x41c, 8, 0x28, 0, 1, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_u_1", -1, cls, 0x420, 8, 0x28, 1, 0, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_v_1", -1, cls, 0x424, 8, 0x28, 1, 1, true),
		new UntestedMthd(opt, rnd(), "draw", -1, cls, 0x540, 0x30),
	};
}